

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractscrollarea_p.h
# Opt level: O0

void __thiscall
QAbstractScrollAreaFilter::QAbstractScrollAreaFilter
          (QAbstractScrollAreaFilter *this,QAbstractScrollAreaPrivate *p)

{
  long lVar1;
  QLatin1StringView str;
  QAnyStringView *in_RSI;
  QLatin1String *in_RDI;
  long in_FS_OFFSET;
  QLatin1String *this_00;
  char *in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  QObject::QObject((QObject *)in_RDI,(QObject *)0x0);
  in_RDI->m_size = (qsizetype)&PTR_metaObject_00d0b830;
  in_RDI[1].m_size = (qsizetype)in_RSI;
  QLatin1String::QLatin1String(this_00,(char *)in_RSI);
  str.m_data = in_stack_ffffffffffffffd8;
  str.m_size = (qsizetype)this_00;
  QAnyStringView::QAnyStringView(in_RSI,str);
  QObject::setObjectName((QAnyStringView *)in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

bool eventFilter(QObject *o, QEvent *e) override
    { return (o == d->viewport ? d->viewportEvent(e) : false); }